

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O0

void __thiscall YAML::detail::node_data::node_data(node_data *this)

{
  undefined1 *in_RDI;
  Mark MVar1;
  undefined8 local_18;
  int local_10;
  
  *in_RDI = 0;
  MVar1 = Mark::null_mark();
  local_18 = MVar1._0_8_;
  *(undefined8 *)(in_RDI + 4) = local_18;
  local_10 = MVar1.column;
  *(int *)(in_RDI + 0xc) = local_10;
  *(undefined4 *)(in_RDI + 0x10) = 1;
  std::__cxx11::string::string((string *)(in_RDI + 0x18));
  *(undefined4 *)(in_RDI + 0x38) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x40));
  memset(in_RDI + 0x60,0,0x18);
  std::vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>::vector
            ((vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_> *)0xf08360);
  *(undefined8 *)(in_RDI + 0x78) = 0;
  memset(in_RDI + 0x80,0,0x18);
  std::
  vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
  ::vector((vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
            *)0xf0838f);
  memset(in_RDI + 0x98,0,0x18);
  std::__cxx11::
  list<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
  ::list((list<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
          *)0xf083b6);
  return;
}

Assistant:

node_data::node_data()
    : m_isDefined(false),
      m_mark(Mark::null_mark()),
      m_type(NodeType::Null),
      m_tag{},
      m_style(EmitterStyle::Default),
      m_scalar{},
      m_sequence{},
      m_seqSize(0),
      m_map{},
      m_undefinedPairs{} {}